

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall
ON_Font::SetFontCharacteristics
          (ON_Font *this,double point_size,wchar_t *gdi_logfont_name,bool bBold,bool bItalic,
          bool bUnderlined,bool bStrikethrough)

{
  Stretch font_stretch;
  byte bVar1;
  bool bVar2;
  double in_XMM1_Qa;
  
  if ((gdi_logfont_name == (wchar_t *)0x0) || (*gdi_logfont_name == L'\0')) {
    gdi_logfont_name = ON_wString::operator_cast_to_wchar_t_(&Default.m_loc_windows_logfont_name);
  }
  font_stretch = Default.m_font_stretch;
  bVar1 = WindowsLogfontCharSetFromFaceName(gdi_logfont_name);
  bVar2 = SetFontCharacteristics
                    (this,point_size,gdi_logfont_name,bBold * '\x03' + Normal,bItalic + Upright,
                     font_stretch,bUnderlined,bStrikethrough,in_XMM1_Qa,(uint)bVar1);
  return bVar2;
}

Assistant:

bool ON_Font::SetFontCharacteristics(
  double point_size,
  const wchar_t * gdi_logfont_name,
  bool bBold,
  bool bItalic, 
  bool bUnderlined,
  bool bStrikethrough
)
{
  if (nullptr == gdi_logfont_name || 0 == gdi_logfont_name[0])
  {
    gdi_logfont_name = ON_Font::Default.m_loc_windows_logfont_name;
  }
  return SetFontCharacteristics(
    point_size,
    gdi_logfont_name,
    (bBold ? ON_Font::Weight::Bold :  ON_Font::Weight::Normal),
    (bItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright),
    ON_Font::Default.m_font_stretch,
    bUnderlined,
    bStrikethrough,
    ON_FontMetrics::DefaultLineFeedRatio,
    ON_Font::WindowsLogfontCharSetFromFaceName(gdi_logfont_name)
    );
}